

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::CenterZoomSearchResults(BoardView *this)

{
  Point PVar1;
  element_type *peVar2;
  int iVar3;
  shared_ptr<Pin> *pp;
  pointer psVar4;
  shared_ptr<Pin> *pn;
  pointer psVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  
  if ((this->config).showPins == false) {
    (this->config).showPins = true;
  }
  if ((this->config).centerZoomSearchResults == true) {
    auVar10 = _DAT_001e9600;
    auVar17 = _DAT_001e9610;
    for (psVar5 = (this->m_pinHighlighted).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        psVar5 != (this->m_pinHighlighted).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      PVar1 = ((psVar5->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->position;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = PVar1.x;
      auVar9._4_4_ = PVar1.y;
      auVar16._8_8_ = 0;
      auVar16._0_4_ = PVar1.x;
      auVar16._4_4_ = PVar1.y;
      auVar17 = minps(auVar16,auVar17);
      auVar10 = maxps(auVar9,auVar10);
    }
    for (psVar4 = (this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 != (this->m_partHighlighted).
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
      peVar2 = (psVar4->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      for (psVar5 = (peVar2->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar5 != (peVar2->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
        PVar1 = ((psVar5->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->position;
        auVar7._8_8_ = 0;
        auVar7._0_4_ = PVar1.x;
        auVar7._4_4_ = PVar1.y;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = PVar1.x;
        auVar13._4_4_ = PVar1.y;
        auVar17 = minps(auVar13,auVar17);
        auVar10 = maxps(auVar7,auVar10);
      }
    }
    fVar18 = auVar17._0_4_;
    fVar19 = auVar17._4_4_;
    auVar8._4_4_ = -(uint)(fVar19 == 3.4028235e+38);
    auVar8._0_4_ = -(uint)(fVar18 == 3.4028235e+38);
    auVar8._8_4_ = -(uint)(auVar10._0_4_ == 1.1754944e-38);
    auVar8._12_4_ = -(uint)(auVar10._4_4_ == 1.1754944e-38);
    iVar3 = movmskps((int)psVar4,auVar8);
    if (iVar3 == 0) {
      auVar14._8_8_ = 0;
      auVar14._0_4_ = (this->m_board_surface).x;
      auVar14._4_4_ = (this->m_board_surface).y;
      if (this->debug == true) {
        CenterZoomSearchResults();
      }
      auVar11._0_4_ = auVar10._0_4_ - fVar18;
      auVar11._4_4_ = auVar10._4_4_ - fVar19;
      auVar11._8_4_ = auVar10._8_4_ - auVar17._8_4_;
      auVar11._12_4_ = auVar10._12_4_ - auVar17._12_4_;
      auVar10 = divps(auVar14,auVar11);
      fVar12 = (float)(~-(uint)(0.0 < auVar11._0_4_) & 0x7f7fffff |
                      auVar10._0_4_ & -(uint)(0.0 < auVar11._0_4_));
      fVar15 = (float)(~-(uint)(0.0 < auVar11._4_4_) & 0x7f7fffff |
                      auVar10._4_4_ & -(uint)(0.0 < auVar11._4_4_));
      if (fVar15 <= fVar12) {
        fVar12 = fVar15;
      }
      fVar15 = this->m_scale_floor;
      fVar12 = (float)(-(uint)(fVar12 == 3.4028235e+38) & (uint)fVar15 |
                      ~-(uint)(fVar12 == 3.4028235e+38) & (uint)fVar12) /
               (this->config).partZoomScaleOutFactor;
      if (fVar15 <= fVar12) {
        fVar15 = fVar12;
      }
      this->m_scale = fVar15;
      fVar12 = (this->m_board_surface).x;
      fVar15 = (this->m_board_surface).y;
      fVar18 = auVar11._0_4_ * 0.5 + fVar18;
      fVar19 = auVar11._4_4_ * 0.5 + fVar19;
      this->m_dx = fVar18;
      this->m_dy = fVar19;
      IVar6 = ScreenToCoord(this,fVar12 * 0.5,fVar15 * 0.5,1.0);
      this->m_dx = (IVar6.x - fVar18) + fVar18;
      this->m_dy = (IVar6.y - fVar19) + fVar19;
      this->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomSearchResults(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.showPins) config.showPins = true; // Louis Rossmann UI failure fix.

	if (!config.centerZoomSearchResults) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pp : m_pinHighlighted) {
		auto &p = pp->position;
		if (p.x < min.x) min.x = p.x;
		if (p.y < min.y) min.y = p.y;
		if (p.x > max.x) max.x = p.x;
		if (p.y > max.y) max.y = p.y;
		i++;
	}

	for (auto &pp : m_partHighlighted) {
		for (auto &pn : pp->pins) {
			auto &p = pn->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;
			i++;
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);
	// fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}